

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxRuntime.cpp
# Opt level: O3

FunctionDefinitionPtr __thiscall Jinx::Impl::Runtime::FindFunction(Runtime *this,RuntimeID id)

{
  element_type *peVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  bool bVar5;
  FunctionDefinitionPtr FVar6;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)(id + 0x1090));
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  lVar4 = *(long *)(id + 0x10d0);
  if (lVar4 != 0) {
    lVar3 = id + 0x10c8;
    do {
      bVar5 = *(ulong *)(lVar4 + 0x20) < in_RDX;
      if (!bVar5) {
        lVar3 = lVar4;
      }
      lVar4 = *(long *)(lVar4 + 0x10 + (ulong)bVar5 * 8);
    } while (lVar4 != 0);
    if ((lVar3 != id + 0x10c8) && (*(ulong *)(lVar3 + 0x20) <= in_RDX)) {
      (this->super_IRuntime)._vptr_IRuntime = *(_func_int ***)(lVar3 + 0x28);
      peVar1 = *(element_type **)(lVar3 + 0x30);
      (this->super_enable_shared_from_this<Jinx::Impl::Runtime>)._M_weak_this.
      super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
      if (peVar1 != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(peVar1->super_enable_shared_from_this<Jinx::Impl::Runtime>)._M_weak_this.
                   super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(peVar1->super_enable_shared_from_this<Jinx::Impl::Runtime>)._M_weak_this.
                        super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1
          ;
          UNLOCK();
        }
        else {
          *(int *)&(peVar1->super_enable_shared_from_this<Jinx::Impl::Runtime>)._M_weak_this.
                   super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(peVar1->super_enable_shared_from_this<Jinx::Impl::Runtime>)._M_weak_this.
                        super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1
          ;
        }
      }
      goto LAB_001e4d41;
    }
  }
  (this->super_IRuntime)._vptr_IRuntime = (_func_int **)0x0;
  (this->super_enable_shared_from_this<Jinx::Impl::Runtime>)._M_weak_this.
  super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
LAB_001e4d41:
  pthread_mutex_unlock((pthread_mutex_t *)(id + 0x1090));
  FVar6.super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  FVar6.super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (FunctionDefinitionPtr)
         FVar6.super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline_t FunctionDefinitionPtr Runtime::FindFunction(RuntimeID id) const
	{
		std::lock_guard<std::mutex> lock(m_functionMutex);
		auto itr = m_functionMap.find(id);
		if (itr == m_functionMap.end())
			return nullptr;
		return itr->second;
	}